

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O0

bool __thiscall gutil::Parameter::findParameter(Parameter *this,string *p)

{
  __type _Var1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  pointer local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  local_20 = (pointer)0x0;
  __lhs = in_RDI;
  while( true ) {
    pbVar2 = (pointer)std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_RDI);
    if (pbVar2 <= local_20) {
      return false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI,(size_type)local_20);
    _Var1 = std::operator==(__lhs,in_RSI);
    if (_Var1) break;
    local_20 = local_20 + 1;
  }
  *(pointer *)(in_RDI + 0x80) = local_20;
  *(pointer *)(in_RDI + 0x88) = local_20 + 1;
  return true;
}

Assistant:

bool Parameter::findParameter(const std::string &p)
{
  assert(allparam.find(p) != allparam.end());

  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i] == p)
    {
      cparam=i;
      pos=i+1;

      return true;
    }
  }

  return false;
}